

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlReadDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt;
  htmlDocPtr pxVar1;
  
  if (cur != (xmlChar *)0x0) {
    xmlInitParser();
    ctxt = htmlCreateDocParserCtxt(cur,(char *)0x0);
    if (ctxt != (htmlParserCtxtPtr)0x0) {
      pxVar1 = htmlDoRead(ctxt,URL,encoding,options,0);
      return pxVar1;
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlReadDoc(const xmlChar * cur, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return (NULL);

    xmlInitParser();
    ctxt = htmlCreateDocParserCtxt(cur, NULL);
    if (ctxt == NULL)
        return (NULL);
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}